

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_functions.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultFunctionGenerator::CreateDefaultEntry
          (DefaultFunctionGenerator *this,ClientContext *context,string *entry_name)

{
  char **ppcVar1;
  Catalog *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args_1;
  array_ptr<const_duckdb::DefaultMacro,_true> macros;
  DefaultMacro *pDVar2;
  bool bVar3;
  CreateMacroInfo *args_2;
  string *in_RCX;
  DefaultMacro *unaff_RBX;
  pointer *__ptr;
  idx_t unaff_R12;
  DefaultMacro *macro;
  unique_ptr<duckdb::CreateFunctionInfo,_std::default_delete<duckdb::CreateFunctionInfo>,_true> info
  ;
  string name;
  string schema;
  _Head_base<0UL,_duckdb::CreateFunctionInfo_*,_false> local_88;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_80;
  CreateFunctionInfo *local_78;
  string local_70;
  string local_50;
  
  StringUtil::Lower(&local_50,
                    (string *)
                    ((context->db).internal.
                     super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2));
  StringUtil::Lower(&local_70,in_RCX);
  macro = (DefaultMacro *)&DAT_019b5b88;
  do {
    bVar3 = DefaultFunctionMatches(macro + -1,&local_50,&local_70);
    ppcVar1 = &macro->name;
    if (bVar3) {
      local_80._M_head_impl = (CatalogEntry *)this;
      if (*ppcVar1 == (char *)0x0) goto LAB_00aac292;
      goto LAB_00aac26a;
    }
    macro = macro + 1;
  } while (*ppcVar1 != (char *)0x0);
  local_88._M_head_impl = (CreateFunctionInfo *)0x0;
  goto LAB_00aac2b0;
  while (pDVar2 = macro + 1, macro = macro + 1, pDVar2->name != (char *)0x0) {
LAB_00aac26a:
    bVar3 = DefaultFunctionMatches(macro,&local_50,&local_70);
    if (!bVar3) break;
  }
LAB_00aac292:
  macros.count = unaff_R12;
  macros.ptr = unaff_RBX;
  CreateInternalMacroInfo(macros);
  local_88._M_head_impl = local_78;
  this = (DefaultFunctionGenerator *)local_80._M_head_impl;
LAB_00aac2b0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_88._M_head_impl == (CreateFunctionInfo *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    args = (Catalog *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    args_1 = (context->db).internal.
             super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    args_2 = (CreateMacroInfo *)
             unique_ptr<duckdb::CreateFunctionInfo,_std::default_delete<duckdb::CreateFunctionInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateFunctionInfo,_std::default_delete<duckdb::CreateFunctionInfo>,_true>
                           *)&local_88);
    make_uniq_base<duckdb::CatalogEntry,duckdb::ScalarMacroCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)this,args,(SchemaCatalogEntry *)args_1,args_2);
  }
  if (local_88._M_head_impl != (CreateFunctionInfo *)0x0) {
    (*((local_88._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DefaultFunctionGenerator::CreateDefaultEntry(ClientContext &context,
                                                                      const string &entry_name) {
	auto info = GetDefaultFunction(schema.name, entry_name);
	if (info) {
		return make_uniq_base<CatalogEntry, ScalarMacroCatalogEntry>(catalog, schema, info->Cast<CreateMacroInfo>());
	}
	return nullptr;
}